

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  uchar uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined4 in_register_00000084;
  uchar *puVar6;
  uchar px [3];
  uchar local_2b [3];
  
  puVar6 = (uchar *)CONCAT44(in_register_00000084,expand_mono);
  if (rgb_dir - 1U < 2) {
    uVar1 = *puVar6;
    local_2b[2] = uVar1;
    local_2b[0] = uVar1;
    local_2b[1] = uVar1;
    if (write_alpha == 0) {
      iVar5 = s->buf_used;
      if (iVar5 - 0x40U < 0xffffffbf) {
        (*s->func)(s->context,s->buffer,iVar5);
        iVar5 = 0;
      }
      s->buf_used = iVar5 + 1;
      s->buffer[iVar5] = uVar1;
      goto LAB_0014667f;
    }
  }
  else {
    if (rgb_dir != 3) {
      if (rgb_dir != 4) goto LAB_0014667f;
      if (comp == 0) {
        bVar2 = puVar6[3];
        lVar4 = 0;
        do {
          lVar3 = (long)(int)(((uint)puVar6[lVar4] - (uint)(byte)(&DAT_00165890)[lVar4]) *
                             (uint)bVar2) * 0x80808081;
          local_2b[lVar4] =
               ((char)(uint)((ulong)lVar3 >> 0x27) - (char)(lVar3 >> 0x3f)) + (&DAT_00165890)[lVar4]
          ;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        goto LAB_0014667a;
      }
    }
    local_2b[2] = puVar6[2];
    local_2b[1] = puVar6[1];
    local_2b[0] = *puVar6;
  }
LAB_0014667a:
  stbiw__write3(s,local_2b[2],local_2b[1],local_2b[0]);
LAB_0014667f:
  if (0 < comp) {
    uVar1 = puVar6[(long)rgb_dir + -1];
    iVar5 = s->buf_used;
    if (iVar5 - 0x40U < 0xffffffbf) {
      (*s->func)(s->context,s->buffer,iVar5);
      iVar5 = 0;
    }
    s->buf_used = iVar5 + 1;
    s->buffer[iVar5] = uVar1;
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      stbiw__write1(s, d[comp - 1]);

   switch (comp) {
      case 2: // 2 pixels = mono + alpha, alpha is written separately, so same as 1-channel case
      case 1:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            stbiw__write1(s, d[0]);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      stbiw__write1(s, d[comp - 1]);
}